

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfSystemSpecific.cpp
# Opt level: O0

void __thiscall Imf_2_5::CpuId::CpuId(CpuId *this)

{
  undefined1 *in_RDI;
  int edx;
  int ecx;
  int ebx;
  int eax;
  int max;
  bool osxsave;
  uint local_20;
  uint local_1c;
  int local_18;
  uint local_14;
  int local_10;
  undefined1 local_9;
  
  *in_RDI = 0;
  in_RDI[1] = 0;
  in_RDI[2] = 0;
  in_RDI[3] = 0;
  in_RDI[4] = 0;
  in_RDI[5] = 0;
  in_RDI[6] = 0;
  local_9 = 0;
  local_10 = 0;
  anon_unknown_1::cpuid(0,&local_10,&local_18,(int *)&local_1c,(int *)&local_20);
  if (0 < local_10) {
    anon_unknown_1::cpuid(1,(int *)&local_14,&local_18,(int *)&local_1c,(int *)&local_20);
    *in_RDI = (local_20 & 0x4000000) != 0;
    in_RDI[1] = (local_1c & 1) != 0;
    in_RDI[2] = (local_1c & 0x200) != 0;
    in_RDI[3] = (local_1c & 0x80000) != 0;
    in_RDI[4] = (local_1c & 0x100000) != 0;
    local_9 = (local_1c & 0x8000000) != 0;
    in_RDI[5] = (local_1c & 0x10000000) != 0;
    in_RDI[6] = (local_1c & 0x20000000) != 0;
    if ((bool)local_9) {
      anon_unknown_1::xgetbv(0,(int *)&local_14,(int *)&local_20);
      if ((local_14 & 6) != 6) {
        in_RDI[6] = 0;
        in_RDI[5] = 0;
      }
    }
    else {
      in_RDI[6] = 0;
      in_RDI[5] = 0;
    }
  }
  return;
}

Assistant:

CpuId::CpuId():
    sse2(false), 
    sse3(false), 
    ssse3(false),
    sse4_1(false), 
    sse4_2(false), 
    avx(false), 
    f16c(false)
{
    bool osxsave = false;
    int  max     = 0;
    int  eax, ebx, ecx, edx;

    cpuid(0, max, ebx, ecx, edx);
    if (max > 0)
    {
        cpuid(1, eax, ebx, ecx, edx);
        sse2    = ( edx & (1<<26) );
        sse3    = ( ecx & (1<< 0) );
        ssse3   = ( ecx & (1<< 9) );
        sse4_1  = ( ecx & (1<<19) );
        sse4_2  = ( ecx & (1<<20) );
        osxsave = ( ecx & (1<<27) );
        avx     = ( ecx & (1<<28) );
        f16c    = ( ecx & (1<<29) );

        if (!osxsave)
        {
            avx = f16c = false;
        }
        else
        {
            xgetbv(0, eax, edx);
            // eax bit 1 - SSE managed, bit 2 - AVX managed
            if ((eax & 6) != 6)
            {
                avx = f16c = false;
            }
        }
    }
}